

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

int __thiscall amrex::Amr::updateInSitu(Amr *this)

{
  return 0;
}

Assistant:

int
Amr::updateInSitu()
{
#if defined(AMREX_USE_SENSEI_INSITU) && !defined(AMREX_NO_SENSEI_AMR_INST)
    if (insitu_bridge && insitu_bridge->update(this))
    {
        amrex::ErrorStream() << "Amr::updateInSitu : Failed to update." << std::endl;
        amrex::Abort();
    }
#endif
    return 0;
}